

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_conn.c
# Opt level: O1

int proxy_conn_process(proxy_conn_handle *pc)

{
  byte *buff;
  uint32_t uVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  void *pvVar4;
  undefined8 *puVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  char *pcVar9;
  size_t sVar10;
  uint unaff_EBP;
  proxy_handle *ppVar11;
  ulong uVar12;
  uint8_t status_buf [13];
  undefined8 in_stack_ffffffffffffff68;
  undefined4 uVar13;
  uint8_t local_58 [5];
  uint local_53;
  uint uStack_4f;
  char local_48 [24];
  
  uVar13 = (undefined4)((ulong)in_stack_ffffffffffffff68 >> 0x20);
  puVar2 = (undefined8 *)pc->priv;
  buff = (byte *)(puVar2 + 0x1b);
  iVar7 = conn_recv((conn_handle *)*puVar2,buff,9);
  if (iVar7 < 0) {
    if (iVar7 < -0x20) {
      if (iVar7 == -0x6b) {
        return -0x6b;
      }
      if (iVar7 == -0x68) {
        return -0x68;
      }
    }
    else {
      if (iVar7 == -0x20) {
        return -0x20;
      }
      if (iVar7 == -4) {
        return -4;
      }
    }
    ppVar11 = pc->ph;
    pcVar9 = strerror(-iVar7);
    proxy_log(ppVar11,LOG_LEVEL_ERROR,"Failed to receive data from client \'%s\' (%d): %s\n",
              puVar2 + 0x21b,(ulong)(uint)-iVar7,pcVar9);
    return iVar7;
  }
  uVar12 = (ulong)*buff;
  switch(*buff) {
  case 1:
    puVar3 = (undefined8 *)pc->priv;
    uStack_4f = 0;
    local_58[0] = '\0';
    local_58[1] = '\0';
    local_58[2] = '\0';
    local_58[3] = '\0';
    local_58[4] = '\0';
    local_53 = 0;
    local_48[0] = '\0';
    local_48[1] = '\0';
    local_48[2] = '\0';
    local_48[3] = '\0';
    local_48[4] = '\0';
    local_48[5] = '\0';
    local_48[6] = '\0';
    local_48[7] = '\0';
    local_48[8] = '\0';
    local_48[9] = '\0';
    local_48[10] = '\0';
    local_48[0xb] = '\0';
    local_48[0xc] = '\0';
    local_48[0xd] = '\0';
    local_48[0xe] = '\0';
    local_48[0xf] = '\0';
    puVar5 = puVar3 + 0x21b;
    proxy_log(pc->ph,LOG_LEVEL_DEBUG,"Processing TCP_OPEN message from client \'%s\'\n",puVar5);
    uVar8 = snprintf(local_48,0x10,"%hu.%hu.%hu.%hu",(ulong)*(byte *)((long)puVar2 + 0xd9),
                     (ulong)*(byte *)((long)puVar2 + 0xda),(ulong)*(byte *)((long)puVar2 + 0xdb),
                     CONCAT44(uVar13,(uint)*(byte *)((long)puVar2 + 0xdc)));
    if (0xfffffff6 < uVar8 - 0x10) {
      uVar8 = conn_connect((conn_handle *)(puVar3 + 9),local_48,"5200");
      if ((int)uVar8 < 0) {
        ppVar11 = pc->ph;
        pcVar9 = strerror(-uVar8);
        proxy_log(ppVar11,LOG_LEVEL_WARN,
                  "Failed to open TCP connection for client \'%s\' (%d): %s\n",puVar5,(ulong)-uVar8,
                  pcVar9);
      }
      else {
        uVar8 = worker_wake((worker_handle *)(puVar3 + 0x17));
        if ((int)uVar8 < 0) {
          conn_close((conn_handle *)(puVar3 + 9));
        }
      }
      local_58[0] = '\x04';
      local_53 = 4;
      uStack_4f = uVar8;
      proxy_log(pc->ph,LOG_LEVEL_DEBUG,"Sending TCP_STATUS message (%d) to client \'%s\'\n",
                (ulong)uVar8,puVar5);
      mutex_lock((mutex_handle *)(puVar3 + 0xe));
      iVar7 = conn_send((conn_handle *)*puVar3,local_58,(ulong)local_53 + 9);
      mutex_unlock((mutex_handle *)(puVar3 + 0xe));
      return iVar7;
    }
    ppVar11 = pc->ph;
    pcVar9 = "Address conversion failed (%d)\n";
    uVar12 = (ulong)uVar8;
    goto LAB_001062ff;
  case 2:
    puVar5 = (undefined8 *)pc->priv;
    uVar12 = (ulong)*(uint *)((long)puVar2 + 0xdd);
    unaff_EBP = 0;
    proxy_log(pc->ph,LOG_LEVEL_DEBUG,"Processing TCP_DATA message (%zu bytes) from client \'%s\'\n",
              uVar12);
    if (uVar12 != 0) {
      iVar7 = 0;
      do {
        sVar10 = 0x1000;
        if (uVar12 < 0x1000) {
          sVar10 = uVar12;
        }
        uVar8 = conn_recv((conn_handle *)*puVar5,buff,sVar10);
        if ((int)uVar8 < 0) {
          return uVar8;
        }
        if (uVar8 == 0) {
          return -0x20;
        }
        if (iVar7 == 0) {
          proxy_log(pc->ph,LOG_LEVEL_DEBUG,
                    "Sending TCP_DATA message (%d bytes) from client \'%s\' to remote host\n",
                    (ulong)uVar8,puVar5 + 0x21b);
          iVar7 = conn_send((conn_handle *)(puVar5 + 9),buff,(ulong)uVar8);
          if (iVar7 < 0) {
            ppVar11 = pc->ph;
            pcVar9 = strerror(-iVar7);
            proxy_log(ppVar11,LOG_LEVEL_DEBUG,"Error sending data to remote host (%d): %s\n",
                      (ulong)(uint)-iVar7,pcVar9);
            conn_close((conn_handle *)(puVar5 + 9));
          }
        }
        uVar12 = uVar12 - uVar8;
      } while (uVar12 != 0);
      unaff_EBP = 0;
      if (iVar7 != 0) {
        send_tcp_close(pc);
      }
    }
    break;
  case 3:
    pvVar4 = pc->priv;
    unaff_EBP = 0;
    proxy_log(pc->ph,LOG_LEVEL_DEBUG,"Processing TCP_CLOSE message from client \'%s\'\n",
              (long)pvVar4 + 0x10d8);
    conn_close((conn_handle *)((long)pvVar4 + 0x48));
    break;
  default:
    ppVar11 = pc->ph;
    pcVar9 = "Invalid data received from client (beginning with %02x)\n";
LAB_001062ff:
    proxy_log(ppVar11,LOG_LEVEL_ERROR,pcVar9,uVar12);
    unaff_EBP = 0xffffffea;
    break;
  case 5:
    puVar5 = (undefined8 *)pc->priv;
    uVar1 = *(uint32_t *)((long)puVar2 + 0xd9);
    uVar12 = (ulong)*(uint *)((long)puVar2 + 0xdd);
    proxy_log(pc->ph,LOG_LEVEL_DEBUG,"Processing UDP_DATA message (%zu bytes) from client \'%s\'\n",
              uVar12);
    do {
      if (uVar12 == 0) {
        return 0;
      }
      sVar10 = 0x1000;
      if (uVar12 < 0x1000) {
        sVar10 = uVar12;
      }
      uVar8 = conn_recv((conn_handle *)*puVar5,buff,sVar10);
      if ((int)uVar8 < 0) {
        bVar6 = false;
        unaff_EBP = uVar8;
      }
      else if (uVar8 == 0) {
        bVar6 = false;
        unaff_EBP = 0xffffffe0;
      }
      else {
        uVar12 = uVar12 - uVar8;
        iVar7 = conn_send_to((conn_handle *)(puVar5 + 5),buff,(ulong)uVar8,uVar1,0x144e);
        bVar6 = true;
        if (iVar7 < 0) {
          ppVar11 = pc->ph;
          pcVar9 = strerror(-iVar7);
          proxy_log(ppVar11,LOG_LEVEL_WARN,
                    "Failed to send UDP_DATA packet of size %zu to client \'%s\': %d (%s)\n",sVar10,
                    puVar5 + 0x21b,(ulong)(uint)-iVar7,pcVar9);
        }
      }
    } while (bVar6);
    break;
  case 6:
    puVar5 = (undefined8 *)pc->priv;
    uVar1 = *(uint32_t *)((long)puVar2 + 0xd9);
    uVar12 = (ulong)*(uint *)((long)puVar2 + 0xdd);
    proxy_log(pc->ph,LOG_LEVEL_DEBUG,
              "Processing UDP_CONTROL message (%zu bytes) from client \'%s\'\n",uVar12);
    do {
      if (uVar12 == 0) {
        return 0;
      }
      sVar10 = 0x1000;
      if (uVar12 < 0x1000) {
        sVar10 = uVar12;
      }
      uVar8 = conn_recv((conn_handle *)*puVar5,buff,sVar10);
      if ((int)uVar8 < 0) {
        bVar6 = false;
        unaff_EBP = uVar8;
      }
      else if (uVar8 == 0) {
        bVar6 = false;
        unaff_EBP = 0xffffffe0;
      }
      else {
        uVar12 = uVar12 - uVar8;
        iVar7 = conn_send_to((conn_handle *)(puVar5 + 1),buff,(ulong)uVar8,uVar1,0x144f);
        bVar6 = true;
        if (iVar7 < 0) {
          ppVar11 = pc->ph;
          pcVar9 = strerror(-iVar7);
          proxy_log(ppVar11,LOG_LEVEL_WARN,
                    "Failed to send UDP_CONTROL packet of size %zu to client \'%s\': %d (%s)\n",
                    sVar10,puVar5 + 0x21b,(ulong)(uint)-iVar7,pcVar9);
        }
      }
    } while (bVar6);
  }
  return unaff_EBP;
}

Assistant:

int proxy_conn_process(struct proxy_conn_handle *pc)
{
	struct proxy_conn_priv *priv = pc->priv;
	int ret;

	ret = conn_recv(priv->conn_client, priv->buff, sizeof(struct proxy_msg));
	if (ret < 0) {
		switch (ret) {
		case -ECONNRESET:
		case -EINTR:
		case -ENOTCONN:
		case -EPIPE:
			break;
		default:
			proxy_log(pc->ph, LOG_LEVEL_ERROR,
				  "Failed to receive data from client '%s' (%d): %s\n",
				  priv->callsign, -ret, strerror(-ret));
			break;
		}

		return ret;
	}

	return process_message(pc, (struct proxy_msg *)priv->buff);
}